

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O1

int ACTION_SCORE::score_comp(void *p1,void *p2)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  fVar1 = *(float *)((long)p2 + 4);
  fVar2 = *(float *)((long)p1 + 4);
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    uVar4 = *p1;
    uVar3 = *p2;
    iVar5 = ((uVar3 < uVar4) - 1) + (uint)(uVar3 < uVar4);
    if (uVar4 == uVar3) {
      iVar5 = 0;
    }
    return iVar5;
  }
  return (fVar1 < fVar2) - 1 | 1;
}

Assistant:

inline int score_comp(const void* p1, const void* p2)
{
  action_score* s1 = (action_score*)p1;
  action_score* s2 = (action_score*)p2;
  // Most sorting algos do not guarantee the output order of elements that compare equal.
  // Tie-breaking on the index ensures that the result is deterministic across platforms.
  // However, this forces a strict ordering, rather than a weak ordering, which carries a performance cost.
  if (s2->score == s1->score)
    return cmp(s1->action, s2->action);
  else if (s2->score >= s1->score)
    return -1;
  else
    return 1;
}